

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# slimc.c
# Opt level: O3

void emitField(item *x,object *y,int indLev)

{
  int a;
  
  getType(y->typeIndex);
  a = getReg();
  if (x->lev == 0 && indLev == 0) {
    x->a = x->a + RISC_MEMSIZE;
    x->indLev = x->indLev + 1;
  }
  if (indLev < 1) {
    put(0x20,a,x->r,x->a);
    put(0x10,a,a,y->val);
  }
  else {
    put(0x33,a,x->r,x->a);
    put(0x10,a,a,y->val);
    x->indLev = indLev;
  }
  regs[x->r] = 0;
  x->r = a;
  x->a = 0;
  x->typeIndex = y->typeIndex;
  if (y->cl == 0x2be) {
    x->mode = 0x2c6;
  }
  return;
}

Assistant:

procedure
void emitField(struct item *x, struct object *y, int indLev) {
	variable int rA;
	variable struct typeDesc *type;
	type = getType(y->typeIndex);
	rA = getReg(); 
	if ((x->lev == 0) && (indLev == 0)) {
		x->a = RISC_MEMSIZE + x->a;
		x->indLev = x->indLev + 1;
	}
	
	/* if indirection level > 0, heap addr. required */
	if (indLev > 0) {
		put(RISC_HLDW,rA,x->r,x->a);
		put(RISC_ADDI,rA,rA,y->val);
		x->indLev = indLev;
	} else {	
		put(RISC_LDW,rA,x->r,x->a); 
		put(RISC_ADDI,rA,rA,y->val);
	}
	regs[x->r] = 0;
	x->r = rA; x->a = 0; x->typeIndex = y->typeIndex; 
	if (y->cl == CLASS_FLD) { 
		/* reset item mode to indirect addr. */
		x->mode = CLASS_IND;  
	}
}